

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_x509.cc
# Opt level: O1

void SSL_CTX_set_client_CA_list(SSL_CTX *ctx,stack_st_X509_NAME *name_list)

{
  if ((ctx != (SSL_CTX *)0x0) &&
     (ctx->cipher_list_by_id != (stack_st_SSL_CIPHER *)bssl::ssl_crypto_x509_method)) {
    __assert_fail("ctx == NULL || ctx->x509_method == &ssl_crypto_x509_method",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_x509.cc"
                  ,0x2c,"void bssl::check_ssl_ctx_x509_method(const SSL_CTX *)");
  }
  (*(code *)ctx->cipher_list_by_id[4].stack.data)(ctx);
  set_client_CA_list((UniquePtr<struct_stack_st_CRYPTO_BUFFER> *)&ctx->extra_certs,
                     (stack_st_X509_NAME *)name_list,
                     (CRYPTO_BUFFER_POOL *)ctx->next_proto_select_cb_arg);
  OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)name_list,sk_X509_NAME_call_free_func,X509_NAME_free);
  return;
}

Assistant:

static void set_client_CA_list(UniquePtr<STACK_OF(CRYPTO_BUFFER)> *ca_list,
                               const STACK_OF(X509_NAME) *name_list,
                               CRYPTO_BUFFER_POOL *pool) {
  UniquePtr<STACK_OF(CRYPTO_BUFFER)> buffers(sk_CRYPTO_BUFFER_new_null());
  if (!buffers) {
    return;
  }

  for (X509_NAME *name : name_list) {
    uint8_t *outp = NULL;
    int len = i2d_X509_NAME(name, &outp);
    if (len < 0) {
      return;
    }

    UniquePtr<CRYPTO_BUFFER> buffer(CRYPTO_BUFFER_new(outp, len, pool));
    OPENSSL_free(outp);
    if (!buffer || !PushToStack(buffers.get(), std::move(buffer))) {
      return;
    }
  }

  *ca_list = std::move(buffers);
}